

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

void Fra_ClassesTest(Fra_Cla_t *p,int Id1,int Id2)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **pClass;
  int Id2_local;
  int Id1_local;
  Fra_Cla_t *p_local;
  
  ppAVar1 = (Aig_Obj_t **)malloc(0x20);
  p->pMemClasses = ppAVar1;
  ppAVar1 = p->pMemClasses;
  if (Id1 < Id2) {
    pAVar2 = Aig_ManObj(p->pAig,Id1);
    *ppAVar1 = pAVar2;
    pAVar2 = Aig_ManObj(p->pAig,Id2);
    ppAVar1[1] = pAVar2;
    ppAVar1[2] = (Aig_Obj_t *)0x0;
    ppAVar1[3] = (Aig_Obj_t *)0x0;
    Fra_ClassObjSetRepr(ppAVar1[1],*ppAVar1);
    Vec_PtrPush(p->vClasses,ppAVar1);
    return;
  }
  __assert_fail("Id1 < Id2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                ,0x253,"void Fra_ClassesTest(Fra_Cla_t *, int, int)");
}

Assistant:

void Fra_ClassesTest( Fra_Cla_t * p, int Id1, int Id2 )
{
    Aig_Obj_t ** pClass;
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 4 );
    pClass = p->pMemClasses;
    assert( Id1 < Id2 );
    pClass[0] = Aig_ManObj( p->pAig, Id1 );
    pClass[1] = Aig_ManObj( p->pAig, Id2 );
    pClass[2] = NULL;
    pClass[3] = NULL;
    Fra_ClassObjSetRepr( pClass[1], pClass[0] );
    Vec_PtrPush( p->vClasses, pClass );
}